

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkInterface
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget)

{
  TargetType TVar1;
  cmGeneratorTarget *pcVar2;
  PolicyStatus PVar3;
  cmLinkImplementation *pcVar4;
  cmLinkImplementationLibraries *pcVar5;
  char *pcVar6;
  pointer __x;
  pointer __obj;
  pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  __p;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  emitted;
  allocator_type local_a9;
  undefined1 local_a8 [32];
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  local_88;
  string *local_60;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_58;
  string local_50;
  
  if (iface->ExplicitLibraries == (char *)0x0) {
    PVar3 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0022);
    if ((PVar3 == WARN) ||
       (PVar3 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0022), PVar3 == OLD)) {
      pcVar5 = GetLinkImplementationLibrariesInternal(this,config,headTarget);
      (iface->super_cmLinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_cmLinkInterface).WrongConfigLibraries,&pcVar5->WrongConfigLibraries)
      ;
    }
  }
  else {
    TVar1 = this->Target->TargetTypeValue;
    if ((TVar1 < UNKNOWN_LIBRARY) && ((0x86U >> (TVar1 & 0x1f) & 1) != 0)) {
      local_60 = config;
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::hashtable(&local_88,100,
                  (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a8,
                  (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50,&local_a9);
      __obj = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
              super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (__obj != (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                   super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
        do {
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::resize(&local_88,local_88._M_num_elements + 1);
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::insert_unique_noresize
                    ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                      *)local_a8,&local_88,&__obj->super_string);
          __obj = __obj + 1;
        } while (__obj != (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                          super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      }
      if (this->Target->TargetTypeValue != INTERFACE_LIBRARY) {
        pcVar4 = GetLinkImplementation(this,local_60);
        __x = (pcVar4->super_cmLinkImplementationLibraries).Libraries.
              super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
              super__Vector_impl_data._M_start;
        if (__x != (pcVar4->super_cmLinkImplementationLibraries).Libraries.
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
          local_58 = &(iface->super_cmLinkInterface).SharedDeps;
          do {
            cmsys::
            hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
            ::resize(&local_88,local_88._M_num_elements + 1);
            cmsys::
            hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
            ::insert_unique_noresize
                      ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                        *)local_a8,&local_88,(value_type *)__x);
            if ((((bool)local_a8[0x10] == true) &&
                (pcVar2 = (__x->super_cmLinkItem).Target, pcVar2 != (cmGeneratorTarget *)0x0)) &&
               (pcVar2->Target->TargetTypeValue == SHARED_LIBRARY)) {
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                        (local_58,&__x->super_cmLinkItem);
            }
            __x = __x + 1;
          } while (__x != (pcVar4->super_cmLinkImplementationLibraries).Libraries.
                          super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::~hashtable(&local_88);
      config = local_60;
    }
  }
  if ((this->Target->TargetTypeValue == STATIC_LIBRARY) &&
     (pcVar4 = GetLinkImplementation(this,config), pcVar4 != (cmLinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_cmLinkInterface).Languages,&pcVar4->Languages);
  }
  if (this->Target->TargetTypeValue != STATIC_LIBRARY) {
    return;
  }
  local_88._0_8_ = (long)&local_88 + 0x10U;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"_","");
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&local_88);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_a8,config);
    std::__cxx11::string::_M_append((char *)&local_88,local_a8._0_8_);
    if ((_Node *)local_a8._0_8_ != (_Node *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    }
  }
  local_a8._0_8_ = (_Node *)(local_a8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"LINK_INTERFACE_MULTIPLICITY","");
  std::__cxx11::string::_M_append(local_a8,local_88._0_8_);
  pcVar6 = cmTarget::GetProperty(this->Target,(string *)local_a8);
  if (pcVar6 == (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"LINK_INTERFACE_MULTIPLICITY","");
    pcVar6 = cmTarget::GetProperty(this->Target,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (pcVar6 == (char *)0x0) goto LAB_0033a42b;
  }
  __isoc99_sscanf(pcVar6,"%u",&(iface->super_cmLinkInterface).Multiplicity);
LAB_0033a42b:
  if ((_Node *)local_a8._0_8_ != (_Node *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
  }
  if (local_88._0_8_ != (long)&local_88 + 0x10U) {
    operator_delete((void *)local_88._0_8_,
                    (long)local_88._M_buckets.
                          super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterface(const std::string& config,
                                    cmOptionalLinkInterface &iface,
                                    cmGeneratorTarget const* headTarget) const
{
  if(iface.ExplicitLibraries)
    {
    if(this->GetType() == cmState::SHARED_LIBRARY
        || this->GetType() == cmState::STATIC_LIBRARY
        || this->GetType() == cmState::INTERFACE_LIBRARY)
      {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      UNORDERED_SET<std::string> emitted;
      for(std::vector<cmLinkItem>::const_iterator
          li = iface.Libraries.begin(); li != iface.Libraries.end(); ++li)
        {
        emitted.insert(*li);
        }
      if (this->GetType() != cmState::INTERFACE_LIBRARY)
        {
        cmLinkImplementation const* impl =
            this->GetLinkImplementation(config);
        for(std::vector<cmLinkImplItem>::const_iterator
              li = impl->Libraries.begin(); li != impl->Libraries.end(); ++li)
          {
          if(emitted.insert(*li).second)
            {
            if(li->Target)
              {
              // This is a runtime dependency on another shared library.
              if(li->Target->GetType() == cmState::SHARED_LIBRARY)
                {
                iface.SharedDeps.push_back(*li);
                }
              }
            else
              {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that creates
              // a chicken-and-egg problem since this list is needed for its
              // construction.
              }
            }
          }
        }
      }
    }
  else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || this->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const*
      impl = this->GetLinkImplementationLibrariesInternal(config,
                                                          headTarget);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
    }

  if(this->LinkLanguagePropagatesToDependents())
    {
    // Targets using this archive need its language runtime libraries.
    if(cmLinkImplementation const* impl =
       this->GetLinkImplementation(config))
      {
      iface.Languages = impl->Languages;
      }
    }

  if(this->GetType() == cmState::STATIC_LIBRARY)
    {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if(!config.empty())
      {
      suffix += cmSystemTools::UpperCase(config);
      }
    else
      {
      suffix += "NOCONFIG";
      }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = "LINK_INTERFACE_MULTIPLICITY";
    propName += suffix;
    if(const char* config_reps = this->GetProperty(propName))
      {
      sscanf(config_reps, "%u", &iface.Multiplicity);
      }
    else if(const char* reps =
            this->GetProperty("LINK_INTERFACE_MULTIPLICITY"))
      {
      sscanf(reps, "%u", &iface.Multiplicity);
      }
    }
}